

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomDate::read(DomDate *this,int __fd,void *__buf,size_t __nbytes)

{
  QStringView other;
  QStringView other_00;
  QStringView other_01;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QLatin1StringView QVar4;
  QStringView tag;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  QLatin1String *in_stack_fffffffffffffec0;
  QLatin1String *a;
  undefined1 in_stack_fffffffffffffec8;
  byte in_stack_fffffffffffffec9;
  byte in_stack_fffffffffffffeca;
  byte in_stack_fffffffffffffecb;
  QLatin1String *pQVar5;
  DomDate *pDVar6;
  storage_type_conflict *in_stack_fffffffffffffee8;
  undefined1 local_d8 [64];
  undefined1 local_98 [64];
  undefined1 local_58 [64];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  a = (QLatin1String *)CONCAT44(in_register_00000034,__fd);
  pDVar6 = this;
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError((QXmlStreamReader *)0x1bb3da);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_001bb6d4;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      local_18._0_8_ = 0xaaaaaaaaaaaaaaaa;
      local_18._8_8_ = 0xaaaaaaaaaaaaaaaa;
      local_18 = QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s((char16_t *)a,(size_t)this);
      QStringView::QStringView<QString,_true>
                ((QStringView *)this,
                 (QString *)
                 CONCAT44(iVar2,CONCAT13(in_stack_fffffffffffffecb,
                                         CONCAT12(in_stack_fffffffffffffeca,
                                                  CONCAT11(in_stack_fffffffffffffec9,
                                                           in_stack_fffffffffffffec8)))));
      other.m_data = in_stack_fffffffffffffee8;
      other.m_size = (qsizetype)pDVar6;
      iVar3 = QStringView::compare
                        ((QStringView *)
                         CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),other,
                         CaseInsensitive);
      in_stack_fffffffffffffecb = iVar3 != 0 ^ 0xff;
      QString::~QString((QString *)0x1bb4ac);
      if ((in_stack_fffffffffffffecb & 1) == 0) {
        Qt::Literals::StringLiterals::operator____s((char16_t *)a,(size_t)this);
        QStringView::QStringView<QString,_true>
                  ((QStringView *)this,
                   (QString *)
                   CONCAT44(iVar2,CONCAT13(in_stack_fffffffffffffecb,
                                           CONCAT12(in_stack_fffffffffffffeca,
                                                    CONCAT11(in_stack_fffffffffffffec9,
                                                             in_stack_fffffffffffffec8)))));
        other_00.m_data = in_stack_fffffffffffffee8;
        other_00.m_size = (qsizetype)pDVar6;
        iVar3 = QStringView::compare
                          ((QStringView *)
                           CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),other_00,
                           CaseInsensitive);
        in_stack_fffffffffffffeca = iVar3 != 0 ^ 0xff;
        QString::~QString((QString *)0x1bb564);
        if ((in_stack_fffffffffffffeca & 1) == 0) {
          Qt::Literals::StringLiterals::operator____s((char16_t *)a,(size_t)this);
          QStringView::QStringView<QString,_true>
                    ((QStringView *)this,
                     (QString *)
                     CONCAT44(iVar2,CONCAT13(in_stack_fffffffffffffecb,
                                             CONCAT12(in_stack_fffffffffffffeca,
                                                      CONCAT11(in_stack_fffffffffffffec9,
                                                               in_stack_fffffffffffffec8)))));
          other_01.m_data = in_stack_fffffffffffffee8;
          other_01.m_size = (qsizetype)pDVar6;
          iVar3 = QStringView::compare
                            ((QStringView *)
                             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),other_01,
                             CaseInsensitive);
          in_stack_fffffffffffffec9 = iVar3 != 0 ^ 0xff;
          QString::~QString((QString *)0x1bb61c);
          if ((in_stack_fffffffffffffec9 & 1) == 0) {
            pQVar5 = a;
            QVar4 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)CONCAT44(iVar2,CONCAT13(in_stack_fffffffffffffecb,
                                                               CONCAT12(in_stack_fffffffffffffeca,
                                                                        CONCAT11(
                                                  in_stack_fffffffffffffec9,
                                                  in_stack_fffffffffffffec8)))),(size_t)a);
            in_stack_fffffffffffffee8 = (storage_type_conflict *)QVar4.m_size;
            ::operator+(a,(QStringView *)
                          CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
            ::QStringBuilder::operator_cast_to_QString
                      ((QStringBuilder<QLatin1String,_const_QStringView_&> *)
                       CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
            QXmlStreamReader::raiseError((QString *)a);
            QString::~QString((QString *)0x1bb6c9);
            in_stack_fffffffffffffec0 = a;
            a = pQVar5;
          }
          else {
            QXmlStreamReader::readElementText(local_d8,a,0);
            iVar2 = QString::toInt((QString *)
                                   CONCAT44(iVar2,CONCAT13(in_stack_fffffffffffffecb,
                                                           CONCAT12(in_stack_fffffffffffffeca,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffec9,
                                                  in_stack_fffffffffffffec8)))),
                                   (bool *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
            setElementDay(this,iVar2);
            QString::~QString((QString *)0x1bb660);
          }
        }
        else {
          QXmlStreamReader::readElementText(local_98,a,0);
          iVar2 = QString::toInt((QString *)
                                 CONCAT44(iVar2,CONCAT13(in_stack_fffffffffffffecb,
                                                         CONCAT12(in_stack_fffffffffffffeca,
                                                                  CONCAT11(in_stack_fffffffffffffec9
                                                                           ,
                                                  in_stack_fffffffffffffec8)))),
                                 (bool *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
          setElementMonth(this,iVar2);
          QString::~QString((QString *)0x1bb5b1);
        }
      }
      else {
        QXmlStreamReader::readElementText(local_58,a,0);
        iVar2 = QString::toInt((QString *)
                               CONCAT44(iVar2,CONCAT13(in_stack_fffffffffffffecb,
                                                       CONCAT12(in_stack_fffffffffffffeca,
                                                                CONCAT11(in_stack_fffffffffffffec9,
                                                                         in_stack_fffffffffffffec8))
                                                      )),(bool *)in_stack_fffffffffffffec0,
                               in_stack_fffffffffffffebc);
        setElementYear(this,iVar2);
        QString::~QString((QString *)0x1bb4f9);
      }
    }
  } while (iVar2 != 5);
LAB_001bb6d4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomDate::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"year"_s, Qt::CaseInsensitive)) {
                setElementYear(reader.readElementText().toInt());
                continue;
            }
            if (!tag.compare(u"month"_s, Qt::CaseInsensitive)) {
                setElementMonth(reader.readElementText().toInt());
                continue;
            }
            if (!tag.compare(u"day"_s, Qt::CaseInsensitive)) {
                setElementDay(reader.readElementText().toInt());
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}